

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O0

size_t __thiscall ans_byte_encode::serialize(ans_byte_encode *this,uint8_t **out_u8)

{
  ushort uVar1;
  reference pvVar2;
  reference pvVar3;
  size_t sVar4;
  long *in_RSI;
  array<unsigned_int,_256UL> *in_RDI;
  size_t bytes_written;
  pointer in_buf;
  size_t sym;
  array<unsigned_int,_256UL> increasing_freqs;
  uint32_t *out_ptr_u32;
  value_type in_stack_fffffffffffffbb8;
  value_type in_stack_fffffffffffffbbc;
  undefined8 local_420;
  size_t in_stack_fffffffffffffc38;
  size_t in_stack_fffffffffffffc40;
  uint32_t *in_stack_fffffffffffffc48;
  uint32_t *in_stack_fffffffffffffc50;
  
  pvVar2 = std::array<unsigned_short,_256UL>::operator[]
                     ((array<unsigned_short,_256UL> *)in_RDI,
                      CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  uVar1 = *pvVar2;
  pvVar3 = std::array<unsigned_int,_256UL>::operator[]
                     (in_RDI,CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  *pvVar3 = (uint)uVar1;
  for (local_420 = 1; local_420 < 0x100; local_420 = local_420 + 1) {
    pvVar3 = std::array<unsigned_int,_256UL>::operator[]
                       (in_RDI,CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    in_stack_fffffffffffffbb8 = *pvVar3;
    pvVar2 = std::array<unsigned_short,_256UL>::operator[]
                       ((array<unsigned_short,_256UL> *)in_RDI,
                        CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    in_stack_fffffffffffffbbc = in_stack_fffffffffffffbb8 + *pvVar2 + 1;
    pvVar3 = std::array<unsigned_int,_256UL>::operator[]
                       (in_RDI,CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    *pvVar3 = in_stack_fffffffffffffbbc;
  }
  std::array<unsigned_int,_256UL>::data((array<unsigned_int,_256UL> *)0x181bf7);
  sVar4 = interpolative_internal::encode
                    (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                     in_stack_fffffffffffffc38);
  *in_RSI = sVar4 + *in_RSI;
  return sVar4;
}

Assistant:

size_t serialize(uint8_t*& out_u8)
    {
        auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
        std::array<uint32_t, constants::MAX_SIGMA> increasing_freqs;
        increasing_freqs[0] = nfreqs[0];
        for (size_t sym = 1; sym < constants::MAX_SIGMA; sym++) {
            increasing_freqs[sym] = increasing_freqs[sym - 1] + nfreqs[sym] + 1;
        }
        auto in_buf = increasing_freqs.data();
        auto bytes_written = interpolative_internal::encode(out_ptr_u32, in_buf,
            constants::MAX_SIGMA,
            constants::MAX_FRAME_SIZE + constants::MAX_SIGMA);

        out_u8 += bytes_written;
        return bytes_written;
    }